

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_fusefref(ASMState *as,IRIns *ir,RegSet allow)

{
  Reg RVar1;
  IRRef in_EDX;
  ASMState *in_RSI;
  long in_RDI;
  RegSet in_stack_ffffffffffffffe8;
  
  *(uint *)(in_RDI + 0xa0) =
       (uint)"\f\b\x10\x10\b\x14\x18\x1c\x06\x10\x06\x18\x06\b\b\b\f"
             [*(ushort *)((long)in_RSI->cost + 2)];
  *(undefined1 *)(in_RDI + 0xa5) = 0x80;
  if ((ushort)in_RSI->cost[0] < 0x8000) {
    *(int *)(in_RDI + 0xa0) =
         *(int *)(*(long *)(in_RDI + 0x90) + (ulong)(ushort)in_RSI->cost[0] * 8) +
         *(int *)(in_RDI + 0xa0);
    *(undefined1 *)(in_RDI + 0xa4) = 0x80;
  }
  else {
    RVar1 = ra_alloc1(in_RSI,in_EDX,in_stack_ffffffffffffffe8);
    *(char *)(in_RDI + 0xa4) = (char)RVar1;
  }
  return;
}

Assistant:

static void asm_fusefref(ASMState *as, IRIns *ir, RegSet allow)
{
  lua_assert(ir->o == IR_FLOAD || ir->o == IR_FREF);
  as->mrm.ofs = field_ofs[ir->op2];
  as->mrm.idx = RID_NONE;
  if (irref_isk(ir->op1)) {
    as->mrm.ofs += IR(ir->op1)->i;
    as->mrm.base = RID_NONE;
  } else {
    as->mrm.base = (uint8_t)ra_alloc1(as, ir->op1, allow);
  }
}